

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar *__first;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ScopedReadLock lock;
  ScopedReadLock local_28;
  
  local_28.pimpl_ = this->pimpl_;
  SerialImpl::readLock(local_28.pimpl_);
  __first = (uchar *)operator_new__((ulong)__buf);
  sVar1 = SerialImpl::read(this->pimpl_,(int)__first,__buf,__nbytes);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             CONCAT44(in_register_00000034,__fd),
             (const_iterator)
             *(uchar **)
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)
               CONCAT44(in_register_00000034,__fd) + 8),__first,__first + sVar1);
  operator_delete__(__first);
  ScopedReadLock::~ScopedReadLock(&local_28);
  return sVar1;
}

Assistant:

size_t
Serial::read (std::vector<uint8_t> &buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  uint8_t *buffer_ = new uint8_t[size];
  size_t bytes_read = 0;

  try {
    bytes_read = this->pimpl_->read (buffer_, size);
  }
  catch (const std::exception &e) {
    delete[] buffer_;
    throw;
  }

  buffer.insert (buffer.end (), buffer_, buffer_+bytes_read);
  delete[] buffer_;
  return bytes_read;
}